

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint *puVar1;
  uint uVar2;
  
  if (3 < (uint)pevents) {
    __assert_fail("(pevents & ~(UV_READABLE | UV_WRITABLE)) == 0","src/unix/poll.c",0x53,
                  "int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  if ((handle->flags & 3) == 0) {
    uv__poll_stop(handle);
    if (pevents != 0) {
      uVar2 = pevents & 1U | 4;
      if (pevents == 1) {
        uVar2 = 1;
      }
      uv__io_start(handle->loop,&handle->io_watcher,uVar2);
      uVar2 = handle->flags;
      if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
        puVar1 = &handle->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
      handle->poll_cb = poll_cb;
    }
    return 0;
  }
  __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/poll.c",0x54,
                "int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE)) == 0);
  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= UV__POLLIN;
  if (pevents & UV_WRITABLE)
    events |= UV__POLLOUT;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}